

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

Abc_Obj_t *
Sfm_DecInsert(Abc_Ntk_t *pNtk,Abc_Obj_t *pPivot,int Limit,Vec_Int_t *vGates,Vec_Wec_t *vFanins,
             Vec_Int_t *vMap,Vec_Ptr_t *vGateHandles,int GateBuf,int GateInv,Vec_Wrd_t *vFuncs,
             Vec_Int_t *vTimeNodes,Sfm_Mit_t *pMit)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  void *pvVar6;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar7;
  Mio_Gate_t *pGate;
  undefined4 in_register_00000014;
  long extraout_RDX;
  long lVar8;
  long extraout_RDX_00;
  long extraout_RDX_01;
  ulong uVar9;
  long lVar10;
  int iFaninNew;
  Abc_Obj_t *local_58;
  int local_4c;
  ulong local_48;
  Vec_Int_t *local_40;
  Vec_Wec_t *local_38;
  
  local_48 = CONCAT44(in_register_00000014,Limit);
  if (vTimeNodes != (Vec_Int_t *)0x0) {
    vTimeNodes->nSize = 0;
  }
  local_38 = vFanins;
  if (vGates->nSize <= Limit) {
    __assert_fail("Limit < Vec_IntSize(vGates)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x6a4,
                  "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                 );
  }
  local_58 = pPivot;
  if (vMap->nSize != Limit) {
    __assert_fail("Limit == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x6a5,
                  "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                 );
  }
  if (Limit + 1 == vGates->nSize) {
    iVar2 = Vec_IntEntryLast(vGates);
    if (iVar2 == GateBuf) {
      iVar2 = Vec_WecEntryEntry(local_38,(int)local_48,(int)extraout_RDX);
      iVar2 = Vec_IntEntry(vMap,iVar2);
      pAVar5 = Abc_NtkObj(pNtk,iVar2);
      pAVar7 = local_58;
      if (pMit != (Sfm_Mit_t *)0x0) {
        Sfm_MitTransferLoad(pMit,pAVar5,local_58);
      }
      Abc_ObjReplace(pAVar7,pAVar5);
      *(uint *)&pAVar5->field_0x14 = *(uint *)&pAVar5->field_0x14 & 0xfff;
      Abc_NtkUpdateIncLevel_rec(pAVar5);
      if (vTimeNodes == (Vec_Int_t *)0x0) {
        return pAVar5;
      }
      Vec_IntPush(vTimeNodes,pAVar5->Id);
      return pAVar5;
    }
    if (iVar2 == GateInv && vTimeNodes == (Vec_Int_t *)0x0) {
      lVar8 = extraout_RDX;
      local_40 = vGates;
      for (uVar9 = 0; pAVar7 = local_58, iVar2 = (local_58->vFanouts).nSize,
          (long)uVar9 < (long)iVar2; uVar9 = uVar9 + 1) {
        lVar8 = (long)(local_58->vFanouts).pArray[uVar9];
        pAVar5 = (Abc_Obj_t *)local_58->pNtk->vObjs->pArray[lVar8];
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 7) break;
        iVar2 = Mio_GateReadValue((Mio_Gate_t *)(pAVar5->field_5).pData);
        local_4c = (pAVar5->vFanins).nSize;
        iVar3 = Abc_NodeFindFanin(pAVar5,pAVar7);
        iVar2 = Sfm_LibFindComplInputGate(vFuncs,iVar2,local_4c,iVar3,(int *)0x0);
        lVar8 = extraout_RDX_00;
        if (iVar2 == -1) {
          iVar2 = (local_58->vFanouts).nSize;
          break;
        }
      }
      vGates = local_40;
      if (iVar2 == (int)uVar9) {
        lVar10 = 0;
        while( true ) {
          pAVar7 = local_58;
          if ((int)uVar9 <= lVar10) {
            iVar2 = Vec_WecEntryEntry(local_38,(int)local_48,(int)lVar8);
            iVar2 = Vec_IntEntry(vMap,iVar2);
            pAVar5 = Abc_NtkObj(pNtk,iVar2);
            Abc_ObjReplace(pAVar7,pAVar5);
            *(uint *)&pAVar5->field_0x14 = *(uint *)&pAVar5->field_0x14 & 0xfff;
            Abc_NtkUpdateIncLevel_rec(pAVar5);
            return pAVar5;
          }
          pAVar7 = (Abc_Obj_t *)local_58->pNtk->vObjs->pArray[(local_58->vFanouts).pArray[lVar10]];
          iVar2 = Abc_NodeFindFanin(pAVar7,local_58);
          iFaninNew = -1;
          iVar3 = Mio_GateReadValue((Mio_Gate_t *)(pAVar7->field_5).pData);
          iVar4 = Sfm_LibFindComplInputGate(vFuncs,iVar3,(pAVar7->vFanins).nSize,iVar2,&iFaninNew);
          if (((iVar4 < 0) || (iVar4 == iVar3)) || (iFaninNew < 0)) break;
          pvVar6 = Vec_PtrEntry(vGateHandles,iVar4);
          (pAVar7->field_5).pData = pvVar6;
          lVar8 = extraout_RDX_01;
          if (iVar2 != iFaninNew) {
            piVar1 = (pAVar7->vFanins).pArray;
            lVar8 = (long)iVar2;
            iVar2 = piVar1[lVar8];
            piVar1[lVar8] = piVar1[iFaninNew];
            piVar1[iFaninNew] = iVar2;
          }
          lVar10 = lVar10 + 1;
          uVar9 = (ulong)(uint)(local_58->vFanouts).nSize;
        }
        __assert_fail("iGateNew >= 0 && iGateNew != iGate && iFaninNew >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x6c8,
                      "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                     );
      }
    }
  }
  pAVar7 = (Abc_Obj_t *)0x0;
  uVar9 = local_48 & 0xffffffff;
  local_40 = vGates;
  while( true ) {
    pAVar5 = local_58;
    iVar2 = (int)uVar9;
    if (vGates->nSize <= iVar2) {
      if (pMit != (Sfm_Mit_t *)0x0) {
        Sfm_MitTimingGrow(pMit);
        Sfm_MitTransferLoad(pMit,pAVar7,pAVar5);
      }
      Abc_ObjReplace(pAVar5,pAVar7);
      uVar9 = local_48;
      while (iVar2 = (int)uVar9, iVar2 < vMap->nSize) {
        iVar3 = Vec_IntEntry(vMap,iVar2);
        pAVar7 = Abc_NtkObj(pNtk,iVar3);
        if (pAVar7 != (Abc_Obj_t *)0x0) {
          Abc_NtkUpdateIncLevel_rec(pAVar7);
        }
        uVar9 = (ulong)(iVar2 + 1);
      }
      return pAVar7;
    }
    local_4c = Vec_IntEntry(vGates,iVar2);
    p = Vec_WecEntry(local_38,iVar2);
    pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
    for (iVar3 = 0; iVar3 < p->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(p,iVar3);
      iVar4 = Vec_IntEntry(vMap,iVar4);
      pAVar5 = Abc_NtkObj(pNtk,iVar4);
      Abc_ObjAddFanin(pAVar7,pAVar5);
    }
    pGate = (Mio_Gate_t *)Vec_PtrEntry(vGateHandles,local_4c);
    (pAVar7->field_5).pData = pGate;
    iVar3 = (pAVar7->vFanins).nSize;
    iVar4 = Mio_GateReadPinNum(pGate);
    if (iVar3 != iVar4) break;
    Vec_IntPush(vMap,pAVar7->Id);
    vGates = local_40;
    if (vTimeNodes != (Vec_Int_t *)0x0) {
      Vec_IntPush(vTimeNodes,pAVar7->Id);
    }
    uVar9 = (ulong)(iVar2 + 1);
  }
  __assert_fail("Abc_ObjFaninNum(pObjNew) == Mio_GateReadPinNum((Mio_Gate_t *)pObjNew->pData)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                ,0x6e4,
                "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
               );
}

Assistant:

Abc_Obj_t * Sfm_DecInsert( Abc_Ntk_t * pNtk, Abc_Obj_t * pPivot, int Limit, Vec_Int_t * vGates, Vec_Wec_t * vFanins, Vec_Int_t * vMap, Vec_Ptr_t * vGateHandles, int GateBuf, int GateInv, Vec_Wrd_t * vFuncs, Vec_Int_t * vTimeNodes, Sfm_Mit_t * pMit )
{
    Abc_Obj_t * pObjNew = NULL; 
    Vec_Int_t * vLevel;
    int i, k, iObj, Gate;
    if ( vTimeNodes )
        Vec_IntClear( vTimeNodes );
    // assuming that new gates are appended at the end
    assert( Limit < Vec_IntSize(vGates) );
    assert( Limit == Vec_IntSize(vMap) );
    if ( Limit + 1 == Vec_IntSize(vGates) )
    {
        Gate = Vec_IntEntryLast(vGates);
        if ( Gate == GateBuf )
        {
            iObj = Vec_WecEntryEntry( vFanins, Limit, 0 );
            pObjNew = Abc_NtkObj( pNtk, Vec_IntEntry(vMap, iObj) );
            // transfer load
            if ( pMit )
                Sfm_MitTransferLoad( pMit, pObjNew, pPivot );
            // replace logic cone
            Abc_ObjReplace( pPivot, pObjNew );
            // update level
            pObjNew->Level = 0;
            Abc_NtkUpdateIncLevel_rec( pObjNew );
            if ( vTimeNodes )
                Vec_IntPush( vTimeNodes, Abc_ObjId(pObjNew) );
            return pObjNew;
        }
        else if ( vTimeNodes == NULL && Gate == GateInv )
        {
            // check if fanouts can be updated
            Abc_Obj_t * pFanout;
            Abc_ObjForEachFanout( pPivot, pFanout, i )
                if ( !Abc_ObjIsNode(pFanout) || Sfm_LibFindComplInputGate(vFuncs, Mio_GateReadValue((Mio_Gate_t*)pFanout->pData), Abc_ObjFaninNum(pFanout), Abc_NodeFindFanin(pFanout, pPivot), NULL) == -1 )
                    break;
            // update fanouts
            if ( i == Abc_ObjFanoutNum(pPivot) )
            {
                Abc_ObjForEachFanout( pPivot, pFanout, i )
                {
                    int iFanin = Abc_NodeFindFanin(pFanout, pPivot), iFaninNew = -1;
                    int iGate = Mio_GateReadValue((Mio_Gate_t*)pFanout->pData);
                    int iGateNew = Sfm_LibFindComplInputGate( vFuncs, iGate, Abc_ObjFaninNum(pFanout), iFanin, &iFaninNew );
                    assert( iGateNew >= 0 && iGateNew != iGate && iFaninNew >= 0 );
                    pFanout->pData = Vec_PtrEntry( vGateHandles, iGateNew );
                    //assert( iFanin == iFaninNew );
                    // swap fanins
                    if ( iFanin != iFaninNew )
                    {
                        int * pArray = Vec_IntArray( &pFanout->vFanins );
                        ABC_SWAP( int, pArray[iFanin], pArray[iFaninNew] );
                    }
                }
                iObj = Vec_WecEntryEntry( vFanins, Limit, 0 );
                pObjNew = Abc_NtkObj( pNtk, Vec_IntEntry(vMap, iObj) );
                Abc_ObjReplace( pPivot, pObjNew );
                // update level
                pObjNew->Level = 0;
                Abc_NtkUpdateIncLevel_rec( pObjNew );
                return pObjNew;
            }
        }
    }
    // introduce new gates
    Vec_IntForEachEntryStart( vGates, Gate, i, Limit )
    {
        vLevel = Vec_WecEntry( vFanins, i );
        pObjNew = Abc_NtkCreateNode( pNtk );
        Vec_IntForEachEntry( vLevel, iObj, k )
            Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, iObj)) );
        pObjNew->pData = Vec_PtrEntry( vGateHandles, Gate );
        assert( Abc_ObjFaninNum(pObjNew) == Mio_GateReadPinNum((Mio_Gate_t *)pObjNew->pData) );
        Vec_IntPush( vMap, Abc_ObjId(pObjNew) );
        if ( vTimeNodes )
            Vec_IntPush( vTimeNodes, Abc_ObjId(pObjNew) );
    }
    // transfer load
    if ( pMit )
    {
        Sfm_MitTimingGrow( pMit );
        Sfm_MitTransferLoad( pMit, pObjNew, pPivot );
    }
    // replace logic cone
    Abc_ObjReplace( pPivot, pObjNew );
    // update level
    Abc_NtkForEachObjVecStart( vMap, pNtk, pObjNew, i, Limit )
        Abc_NtkUpdateIncLevel_rec( pObjNew );
    return pObjNew;
}